

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

pair<bool,_bool> kratos::correct_port_direction(Port *port1,Port *port2,Generator *top)

{
  Generator *pGVar1;
  byte same_direction;
  ushort uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Port *pPVar6;
  ushort uVar7;
  bool bVar8;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  Generator *local_38;
  Generator *pGVar4;
  
  iVar3 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0xd])();
  pGVar4 = (Generator *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0xd])(port2);
  local_38 = (Generator *)CONCAT44(extraout_var_00,iVar3);
  if (pGVar4 == top && pGVar4 == local_38) {
    iVar3 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(port1);
    if ((((char)iVar3 == '\0') ||
        (iVar3 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(port2), pPVar6 = port1,
        (char)iVar3 != '\0')) &&
       ((iVar3 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(port2), (char)iVar3 == '\0'
        || (iVar3 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(port1), pPVar6 = port2,
           (char)iVar3 != '\0')))) {
      same_direction = false;
    }
    else {
      same_direction = *(byte *)(pPVar6[1].super_Var.super_IRNode._vptr_IRNode + 0x10) ^ 1;
    }
    check_direction(port1,port2,(bool)same_direction);
    uVar7 = (ushort)(same_direction ^ port1->direction_ != In);
  }
  else {
    if (pGVar4 == top) {
      std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::Generator,void>
                ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                 (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_38->super_enable_shared_from_this<kratos::Generator>);
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(top->children_)._M_h,(key_type *)(local_60 + 0x98));
      bVar8 = iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
              ._M_cur != (__node_type *)0x0;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      check_direction(port1,port2,true);
      uVar7 = (ushort)(port1->direction_ != In);
    }
    else {
      if (local_38 == top) {
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   &pGVar4->super_enable_shared_from_this<kratos::Generator>);
        iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(top->children_)._M_h,(key_type *)(local_50 + 0x98));
        bVar8 = iVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
                ._M_cur != (__node_type *)0x0;
      }
      else {
        bVar8 = false;
      }
      if ((local_38 == top) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      pGVar1 = local_38;
      if (bVar8) {
        bVar8 = true;
      }
      else {
        iVar3 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])(pGVar4);
        local_40 = CONCAT44(extraout_var_01,iVar3);
        iVar3 = (*(pGVar1->super_IRNode)._vptr_IRNode[4])(pGVar1);
        if ((local_40 != CONCAT44(extraout_var_02,iVar3)) ||
           (iVar3 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])(pGVar4),
           (Generator *)CONCAT44(extraout_var_03,iVar3) != top)) {
          uVar7 = 0;
          uVar2 = 0;
          goto LAB_0018f09e;
        }
        bVar8 = false;
      }
      check_direction(port1,port2,bVar8);
      uVar7 = (ushort)(port1->direction_ == In);
    }
  }
  uVar2 = 0x100;
LAB_0018f09e:
  return (pair<bool,_bool>)(uVar2 | uVar7);
}

Assistant:

std::pair<bool, bool> correct_port_direction(Port *port1, Port *port2, Generator *top) {
    auto *parent1 = port1->generator();
    auto *parent2 = port2->generator();
    std::shared_ptr<AssignStmt> stmt;
    if (parent1 == parent2 && parent1 == top) {
        // it's the same module
        // by default same direction is fault, however, for modport ones, it is the same direction
        bool interface_port_wire = false;
        if (port1->is_interface() && !port2->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port1);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        } else if (port2->is_interface() && !port1->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port2);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        }
        check_direction(port1, port2, interface_port_wire);
        bool dir_in = port1->port_direction() == PortDirection::In;
        return {(interface_port_wire == dir_in), true};
    } else {
        if (parent1 == top && top->has_child_generator(parent2->shared_from_this())) {
            check_direction(port1, port2, true);
            return {port1->port_direction() != PortDirection::In, true};
        } else if (parent2 == top && top->has_child_generator(parent1->shared_from_this())) {
            check_direction(port1, port2, true);
            return {(port1->port_direction() == PortDirection::In), true};
        } else if (parent1->parent() == parent2->parent() && parent1->parent() == top) {
            check_direction(port1, port2, false);
            return {(port1->port_direction() == PortDirection::In), true};
        } else {
            return {false, false};
        }
    }
}